

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int channel_mix_2_0_to_1_0(mixed_segment *segment)

{
  uint local_3c;
  float *pfStack_38;
  uint32_t i;
  float *out;
  float *r;
  float *l;
  undefined8 *puStack_18;
  uint32_t frames;
  channel_data *data;
  mixed_segment *segment_local;
  
  puStack_18 = (undefined8 *)segment->data;
  l._4_4_ = 0xffffffff;
  data = (channel_data *)segment;
  mixed_buffer_request_read(&r,(uint32_t *)((long)&l + 4),(mixed_buffer *)*puStack_18);
  mixed_buffer_request_read(&out,(uint32_t *)((long)&l + 4),(mixed_buffer *)puStack_18[1]);
  mixed_buffer_request_write
            (&stack0xffffffffffffffc8,(uint32_t *)((long)&l + 4),(mixed_buffer *)puStack_18[0xe]);
  for (local_3c = 0; local_3c < l._4_4_; local_3c = local_3c + 1) {
    pfStack_38[local_3c] = (r[local_3c] + out[local_3c]) * 0.5;
  }
  mixed_buffer_finish_read(l._4_4_,(mixed_buffer *)*puStack_18);
  mixed_buffer_finish_read(l._4_4_,(mixed_buffer *)puStack_18[1]);
  mixed_buffer_finish_write(l._4_4_,(mixed_buffer *)puStack_18[0xe]);
  return 1;
}

Assistant:

VECTORIZE int channel_mix_2_0_to_1_0(struct mixed_segment *segment){
  struct channel_data *data = (struct channel_data *)segment->data;

  uint32_t frames = UINT32_MAX;
  float *restrict l, *restrict r, *restrict out;
  mixed_buffer_request_read(&l, &frames, data->in[MIXED_LEFT]);
  mixed_buffer_request_read(&r, &frames, data->in[MIXED_RIGHT]);
  mixed_buffer_request_write(&out, &frames, data->out[MIXED_MONO]);
  for(uint32_t i=0; i<frames; ++i){
    out[i] = (l[i]+r[i])*0.5;
  }
  mixed_buffer_finish_read(frames, data->in[MIXED_LEFT]);
  mixed_buffer_finish_read(frames, data->in[MIXED_RIGHT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_MONO]);
  
  return 1;
}